

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

void Close(FILE *file)

{
  int iVar1;
  ostream *poVar2;
  FILE *in_RDI;
  Logger *in_stack_fffffffffffffef0;
  allocator *this;
  allocator local_b9;
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string local_90 [4];
  LogSeverity in_stack_ffffffffffffff74;
  Logger local_70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  Logger local_c [3];
  
  if (in_RDI == (FILE *)0x0) {
    Logger::Logger(local_c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Close",&local_69);
    poVar2 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x95);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"file");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    Logger::~Logger(in_stack_fffffffffffffef0);
    abort();
  }
  iVar1 = fclose(in_RDI);
  if (iVar1 == -1) {
    Logger::Logger(&local_70,FATAL);
    this = (allocator *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Close",&local_b9);
    poVar2 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
    std::operator<<(poVar2,"Error: invoke fclose().");
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    Logger::~Logger((Logger *)this);
  }
  return;
}

Assistant:

inline void Close(FILE *file) {
  CHECK_NOTNULL(file);
  if (fclose(file) == EOF) {
    LOG(FATAL) << "Error: invoke fclose().";
  }
}